

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O0

void test_skiplist_query_exist_populated_several(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  char local_7c;
  int iStack_78;
  ion_status_t status_1;
  ion_byte_t value [10];
  char find_value [10];
  ion_status_t status;
  int i;
  ion_byte_t test_value [10];
  ion_skiplist_t skiplist;
  planck_unit_test_t *tc_local;
  
  initialize_skiplist_std_conditions((ion_skiplist_t *)(test_value + 2));
  status.error = '\0';
  status._1_3_ = 0;
  while( true ) {
    if (99 < (int)status._0_4_) {
      status.error = '\0';
      status._1_3_ = 0;
      while( true ) {
        if (99 < (int)status._0_4_) {
          sl_destroy((ion_skiplist_t *)(test_value + 2));
          return;
        }
        sprintf((char *)(value + 2),"Find %d",(ulong)(uint)status._0_4_);
        iVar2 = sl_get((ion_skiplist_t *)(test_value + 2),&status,&status_1);
        local_7c = iVar2.error;
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(local_7c == '\0'),0x336,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        iStack_78 = iVar2.count;
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(iStack_78 == 1),0x337,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        pVar1 = planck_unit_assert_str_are_equal
                          (tc,&status_1.error,(char *)(value + 2),0x338,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                          );
        if (pVar1 == '\0') break;
        status._0_4_ = status._0_4_ + 1;
      }
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    sprintf((char *)((long)&status.count + 2),"Find %d",(ulong)(uint)status._0_4_);
    iVar2 = sl_insert((ion_skiplist_t *)(test_value + 2),&status,
                      (ion_value_t)((long)&status.count + 2));
    find_value[2] = iVar2.error;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(find_value[2] == '\0'),0x326,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    find_value._6_4_ = iVar2.count;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(find_value._6_4_ == 1),0x327,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    status._0_4_ = status._0_4_ + 1;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_query_exist_populated_several(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t test_value[10];

	int i;

	for (i = 0; i < 100; i++) {
		sprintf((char *) test_value, "Find %d", i);

		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, test_value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	char		find_value[10];
	ion_byte_t	value[10];

	for (i = 0; i < 100; i++) {
		sprintf(find_value, "Find %d", i);

		ion_status_t status = sl_get(&skiplist, (ion_key_t) &i, value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, find_value);
	}

	sl_destroy(&skiplist);
}